

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

vector<Config::Size,_std::allocator<Config::Size>_> *
App::arrangeGlyphs(vector<Config::Size,_std::allocator<Config::Size>_> *__return_storage_ptr__,
                  Glyphs *glyphs,Config *config)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  iterator __position;
  Glyphs *this;
  uint32_t uVar5;
  pointer pRVar6;
  mapped_type *pmVar7;
  runtime_error *this_00;
  uint32_t uVar8;
  pointer pRVar9;
  pointer pSVar10;
  uint uVar11;
  pointer pSVar12;
  ulong uVar13;
  ulong uVar14;
  uint width;
  uint32_t *__k;
  pointer pRVar15;
  uint32_t uVar16;
  ulong uVar17;
  uint32_t uVar18;
  Size lastSize;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> glyphRectangles;
  vector<rbp::Rect,_std::allocator<rbp::Rect>_> arrangedRectangles;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> glyphRectanglesCopy;
  MaxRectsBinPack mrbp;
  Size local_e8;
  vector<Config::Size,std::allocator<Config::Size>> *local_e0;
  uint32_t local_d8;
  uint32_t local_d4;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> local_d0;
  pointer local_b8;
  pointer local_b0;
  vector<rbp::Rect,_std::allocator<rbp::Rect>_> local_a8;
  Config *local_90;
  Glyphs *local_88;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> local_80;
  MaxRectsBinPack local_68;
  
  uVar8 = (config->padding).up;
  uVar5 = (config->padding).left;
  uVar16 = (config->spacing).hor;
  uVar18 = (config->padding).right;
  uVar2 = (config->spacing).ver;
  uVar3 = (config->padding).down;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = (vector<Config::Size,std::allocator<Config::Size>> *)__return_storage_ptr__;
  getGlyphRectangles(&local_d0,glyphs,uVar5 + uVar16 + uVar18,uVar8 + uVar2 + uVar3,config);
  rbp::MaxRectsBinPack::MaxRectsBinPack(&local_68);
  local_90 = config;
  local_88 = glyphs;
  do {
    local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::vector(&local_80,&local_d0);
    local_e8.w = 0;
    local_e8.h = 0;
    uVar17 = 0;
    for (pRVar6 = local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pRVar6 != local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl
                  .super__Vector_impl_data._M_finish; pRVar6 = pRVar6 + 1) {
      uVar17 = uVar17 + (long)pRVar6->height * (long)pRVar6->width;
    }
    pSVar10 = (config->textureSizeList).
              super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar12 = (config->textureSizeList).
              super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pRVar6 = local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar9 = local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pSVar12 - (long)pSVar10 != 0) {
      uVar13 = (long)pSVar12 - (long)pSVar10 >> 3;
      uVar14 = 0;
      do {
        width = pSVar10[uVar14].w - (config->spacing).hor;
        uVar11 = pSVar10[uVar14].h - (config->spacing).ver;
        uVar1 = uVar14 + 1;
        if ((uVar17 <= (ulong)uVar11 * (ulong)width) || (uVar13 <= uVar1)) {
          local_e8 = pSVar10[uVar14];
          std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::operator=(&local_d0,&local_80)
          ;
          rbp::MaxRectsBinPack::Init(&local_68,width,uVar11);
          rbp::MaxRectsBinPack::Insert(&local_68,&local_d0,&local_a8,RectBestAreaFit);
          pRVar6 = local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pRVar9 = local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          pSVar10 = (config->textureSizeList).
                    super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pSVar12 = (config->textureSizeList).
                    super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pRVar9 = local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar13 = (long)pSVar12 - (long)pSVar10 >> 3;
        uVar14 = uVar1;
      } while (uVar1 < uVar13);
    }
    local_b0 = local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar15 = local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pRVar6 != pRVar9) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"can not fit glyphs into texture");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar5 = 0;
      uVar8 = 0;
      local_b8 = local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pRVar15 = local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        this = local_88;
        uVar18 = (config->spacing).hor + pRVar15->x;
        uVar16 = (config->spacing).ver + pRVar15->y;
        __k = &pRVar15->tag;
        local_d8 = uVar8;
        local_d4 = uVar5;
        pmVar7 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](local_88,__k);
        pmVar7->x = uVar18;
        pmVar7 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](this,__k);
        pmVar7->y = uVar16;
        lVar4 = *(long *)local_e0;
        pSVar10 = *(pointer *)(local_e0 + 8);
        pmVar7 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](this,__k);
        config = local_90;
        pmVar7->page = (uint32_t)((ulong)((long)pSVar10 - lVar4) >> 3);
        uVar11 = uVar18 + pRVar15->width;
        uVar8 = local_d8;
        if (local_d8 <= uVar11) {
          uVar8 = uVar11;
        }
        uVar11 = uVar16 + pRVar15->height;
        uVar5 = local_d4;
        if (local_d4 <= uVar11) {
          uVar5 = uVar11;
        }
        pRVar15 = pRVar15 + 1;
      } while (pRVar15 != local_b0);
      if (local_90->cropTexturesWidth != false) {
        local_e8.w = uVar8;
      }
      if (local_90->cropTexturesHeight == true) {
        local_e8.h = uVar5;
      }
      __position._M_current = *(Size **)(local_e0 + 8);
      if (__position._M_current == *(Size **)(local_e0 + 0x10)) {
        std::vector<Config::Size,std::allocator<Config::Size>>::
        _M_realloc_insert<Config::Size_const&>(local_e0,__position,&local_e8);
        pRVar15 = local_b8;
      }
      else {
        *__position._M_current = local_e8;
        *(long *)(local_e0 + 8) = *(long *)(local_e0 + 8) + 8;
        pRVar15 = local_b8;
      }
    }
    if (local_80.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pRVar15 == local_b0) {
      if (local_68.freeRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.freeRectangles.
                        super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_68.usedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.usedRectangles.
                        super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return (vector<Config::Size,_std::allocator<Config::Size>_> *)local_e0;
    }
  } while( true );
}

Assistant:

std::vector<Config::Size> App::arrangeGlyphs(Glyphs& glyphs, const Config& config)
{
    const auto additionalWidth = config.spacing.hor + config.padding.left + config.padding.right;
    const auto additionalHeight = config.spacing.ver + config.padding.up + config.padding.down;
    std::vector<Config::Size> result;

    auto glyphRectangles = getGlyphRectangles(glyphs, additionalWidth, additionalHeight, config);

    rbp::MaxRectsBinPack mrbp;

    for (;;)
    {
        std::vector<rbp::Rect> arrangedRectangles;
        auto glyphRectanglesCopy = glyphRectangles;
        Config::Size lastSize;

        uint64_t allGlyphSquare = 0;
        for (const auto& i : glyphRectangles)
            allGlyphSquare += static_cast<uint64_t>(i.width) * i.height;

        for (size_t i = 0; i < config.textureSizeList.size(); ++i)
        {
            const auto& ss = config.textureSizeList[i];

            //TODO: check workAreaW,H
            const auto workAreaW = ss.w - config.spacing.hor;
            const auto workAreaH = ss.h - config.spacing.ver;

            uint64_t textureSquare = static_cast<uint64_t>(workAreaW) * workAreaH;
            if (textureSquare < allGlyphSquare && i + 1 < config.textureSizeList.size())
                continue;

            lastSize = ss;
            glyphRectangles = glyphRectanglesCopy;

            mrbp.Init(workAreaW, workAreaH);
            mrbp.Insert(glyphRectangles, arrangedRectangles, rbp::MaxRectsBinPack::RectBestAreaFit);

            if (glyphRectangles.empty())
                break;
        }

        if (arrangedRectangles.empty())
        {
            if (!glyphRectangles.empty())
                throw std::runtime_error("can not fit glyphs into texture");
            break;
        }

        std::uint32_t maxX = 0;
        std::uint32_t maxY = 0;
        for (const auto& r: arrangedRectangles)
        {
            std::uint32_t x = r.x + config.spacing.hor;
            std::uint32_t y = r.y + config.spacing.ver;

            glyphs[r.tag].x = x;
            glyphs[r.tag].y = y;
            glyphs[r.tag].page = static_cast<std::uint32_t>(result.size());

            if (maxX < x + r.width)
                maxX = x + r.width;
            if (maxY < y + r.height)
                maxY = y + r.height;
        }
        if (config.cropTexturesWidth)
            lastSize.w = maxX;
        if (config.cropTexturesHeight)
            lastSize.h = maxY;

        result.push_back(lastSize);
    }

    return result;
}